

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<int,float>(BaseAppender *this,Vector *col,int input)

{
  bool bVar1;
  undefined1 auVar2 [12];
  float result;
  float local_3c;
  string local_38;
  
  bVar1 = TryCast::Operation<int,float>(input,&local_3c,false);
  if (bVar1) {
    *(float *)(col->data + (this->chunk).count * 4) = local_3c;
    return;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<int,float>(&local_38,(duckdb *)(ulong)(uint)input,auVar2._8_4_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}